

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall Catch::ConsoleReporter::lazyPrintWithoutClosingBenchmarkTable(ConsoleReporter *this)

{
  long in_RDI;
  ConsoleReporter *in_stack_00000020;
  ConsoleReporter *in_stack_00000060;
  ConsoleReporter *in_stack_00000070;
  
  if ((*(byte *)(in_RDI + 0x48) & 1) == 0) {
    lazyPrintRunInfo(in_stack_00000070);
  }
  if ((*(byte *)(in_RDI + 0x88) & 1) == 0) {
    lazyPrintGroupInfo(in_stack_00000020);
  }
  if ((*(byte *)(in_RDI + 0x170) & 1) == 0) {
    printTestCaseAndSectionHeader(in_stack_00000060);
    *(undefined1 *)(in_RDI + 0x170) = 1;
  }
  return;
}

Assistant:

void ConsoleReporter::lazyPrintWithoutClosingBenchmarkTable() {

    if (!currentTestRunInfo.used)
        lazyPrintRunInfo();
    if (!currentGroupInfo.used)
        lazyPrintGroupInfo();

    if (!m_headerPrinted) {
        printTestCaseAndSectionHeader();
        m_headerPrinted = true;
    }
}